

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

void cpsr_write_arm(CPUARMState *env,uint32_t val,uint32_t mask,CPSRWriteType write_type)

{
  ulong uVar1;
  _Bool _Var2;
  uint uVar3;
  ulong uVar4;
  uint64_t uVar5;
  uint uVar6;
  
  if (0xfffffff < mask) {
    env->ZF = ~val & 0x40000000;
    env->NF = val;
    env->CF = val >> 0x1d & 1;
    env->VF = val * 8 & 0x80000000;
  }
  if ((mask >> 0x1b & 1) != 0) {
    env->QF = val >> 0x1b & 1;
  }
  if ((mask & 0x20) != 0) {
    env->thumb = val >> 5 & 1;
  }
  if ((mask & 0x6000000) != 0) {
    env->condexec_bits = val >> 0x19 & 3 | env->condexec_bits & 0xfffffffc;
  }
  if ((mask & 0xfc00) != 0) {
    env->condexec_bits = val >> 8 & 0xfc | env->condexec_bits & 3;
  }
  if ((mask & 0xf0000) != 0) {
    env->GE = val >> 0x10 & 0xf;
  }
  if (((write_type != CPSRWriteRaw) && (write_type != CPSRWriteByUnicorn)) &&
     (uVar1 = env->features, (uVar1 & 0x308000000) == 0x200000000)) {
    if (env->aarch64 == 0) {
      if ((env->uncached_cpsr & 0x1f) != 0x16) goto LAB_005817ea;
    }
    else if ((~env->pstate & 0xc) != 0) {
LAB_005817ea:
      uVar4 = (env->cp15).scr_el3;
      if ((uVar4 & 1) != 0) {
        uVar3 = ((uint)env->daif ^ val) & mask;
        uVar6 = mask & 0xfffffeff;
        if ((uVar4 & 0x20) != 0) {
          uVar6 = mask;
        }
        if ((uVar3 >> 8 & 1) != 0) {
          mask = uVar6;
        }
        if ((uVar3 & 0x40) != 0) {
          uVar6 = mask;
          if ((uVar4 & 0x10) == 0) {
            uVar6 = mask & 0xffffffbf;
          }
          _Var2 = arm_is_secure(env);
          uVar4 = (ulong)_Var2 << 4 | 0x2a8;
          if (((uint)uVar1 >> 0x1c & 1) != 0) {
            uVar4 = 0x2a8;
          }
          uVar3 = mask & 0xffffffbf;
          if ((*(byte *)((long)env->regs + uVar4 + 3) & 8) == 0) {
            uVar3 = uVar6;
          }
          mask = uVar6;
          if ((val & 0x40) != 0) {
            mask = uVar3;
          }
        }
      }
    }
  }
  uVar6 = (uint)env->daif;
  env->daif = (ulong)((val ^ uVar6) & mask & 0x1c0 ^ uVar6);
  uVar6 = mask;
  if ((write_type == CPSRWriteRaw) || (((env->uncached_cpsr ^ val) & mask & 0x1f) == 0))
  goto LAB_00581a7f;
  uVar3 = env->uncached_cpsr & 0x1f;
  if (uVar3 == 0x10) {
    if (write_type != CPSRWriteByUnicorn) {
      uVar6 = mask & 0xffffffe0;
      goto LAB_00581a7f;
    }
    goto LAB_00581a7a;
  }
  if ((write_type == CPSRWriteByInstr) && ((val & 0x1f) == 0x1a || uVar3 == 0x1a))
  goto LAB_00581a5f;
  switch(val & 0x1f) {
  case 0x10:
    break;
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x17:
  case 0x1b:
  case 0x1f:
    if ((write_type == CPSRWriteByInstr && uVar3 == 0x16) &&
       (uVar5 = arm_hcr_el2_eff_arm(env), ((uint)uVar5 >> 0x1b & 1) != 0)) goto LAB_00581a5f;
    break;
  default:
    goto switchD_005818e6_caseD_14;
  case 0x16:
    uVar1 = env->features;
    if (((uint)uVar1 >> 9 & 1) == 0) {
      if (env->aarch64 == 0) {
        if (uVar3 == 0x10) {
          uVar3 = 0;
        }
        else if (uVar3 == 0x16) {
LAB_00581a45:
          uVar3 = 3;
        }
        else if (uVar3 == 0x1a) {
          uVar3 = 2;
        }
        else {
          if ((uVar1 >> 0x21 & 1) != 0) {
            if (uVar3 == 0x16) {
              uVar3 = 3;
              if (((uint)uVar1 >> 0x1c & 1) == 0) goto LAB_00581a4a;
            }
            else if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) goto LAB_00581a45;
          }
          uVar3 = 1;
        }
      }
      else {
        uVar3 = env->pstate >> 2 & 3;
      }
    }
    else {
      uVar3 = 1;
      if ((env->v7m).exception == 0) {
        uVar3 = ~(env->v7m).control[(env->v7m).secure] & 1;
      }
    }
LAB_00581a4a:
    uVar3 = (uint)(uVar3 < 3);
LAB_00581a52:
    if (uVar3 != 0) goto switchD_005818e6_caseD_14;
    break;
  case 0x1a:
    uVar1 = env->features;
    if ((uVar1 & 0x100000200) == 0x100000000) {
      if (env->aarch64 == 0) {
        if (uVar3 != 0x10) {
          if ((uVar3 == 0x16) || (uVar3 == 0x1a)) goto LAB_005819db;
          if ((uVar1 >> 0x21 & 1) != 0) {
            if (uVar3 == 0x16) {
              if (((uint)uVar1 >> 0x1c & 1) == 0) {
LAB_005819db:
                if ((uVar1 >> 0x21 & 1) != 0) {
                  uVar3 = ~(uint)(env->cp15).scr_el3 & 1;
                  goto LAB_00581a52;
                }
                break;
              }
            }
            else if ((uVar1 & 0x10000000) == 0 && ((env->cp15).scr_el3 & 1) == 0) goto LAB_005819db;
          }
        }
      }
      else if ((env->pstate & 8) != 0) goto LAB_005819db;
    }
    goto switchD_005818e6_caseD_14;
  }
LAB_00581a7a:
  switch_mode(env,val & 0x1f);
LAB_00581a7f:
  env->uncached_cpsr = (val ^ env->uncached_cpsr) & uVar6 & 0x1f0021f ^ env->uncached_cpsr;
  return;
switchD_005818e6_caseD_14:
  uVar6 = mask & 0xffffffe0;
  if (write_type != CPSRWriteByGDBStub) {
LAB_00581a5f:
    uVar6 = mask & 0xffffffe0;
    if ((env->features & 0x8000000) != 0) {
      uVar6 = uVar6 | 0x100000;
      val = val | 0x100000;
    }
  }
  goto LAB_00581a7f;
}

Assistant:

void cpsr_write(CPUARMState *env, uint32_t val, uint32_t mask,
                CPSRWriteType write_type)
{
    uint32_t changed_daif;

    if (mask & CPSR_NZCV) {
        env->ZF = (~val) & CPSR_Z;
        env->NF = val;
        env->CF = (val >> 29) & 1;
        env->VF = (val << 3) & 0x80000000;
    }
    if (mask & CPSR_Q)
        env->QF = ((val & CPSR_Q) != 0);
    if (mask & CPSR_T)
        env->thumb = ((val & CPSR_T) != 0);
    if (mask & CPSR_IT_0_1) {
        env->condexec_bits &= ~3;
        env->condexec_bits |= (val >> 25) & 3;
    }
    if (mask & CPSR_IT_2_7) {
        env->condexec_bits &= 3;
        env->condexec_bits |= (val >> 8) & 0xfc;
    }
    if (mask & CPSR_GE) {
        env->GE = (val >> 16) & 0xf;
    }

    /* In a V7 implementation that includes the security extensions but does
     * not include Virtualization Extensions the SCR.FW and SCR.AW bits control
     * whether non-secure software is allowed to change the CPSR_F and CPSR_A
     * bits respectively.
     *
     * In a V8 implementation, it is permitted for privileged software to
     * change the CPSR A/F bits regardless of the SCR.AW/FW bits.
     */
    if (write_type != CPSRWriteByUnicorn &&
         write_type != CPSRWriteRaw && 
         !arm_feature(env, ARM_FEATURE_V8) &&
        arm_feature(env, ARM_FEATURE_EL3) &&
        !arm_feature(env, ARM_FEATURE_EL2) &&
        !arm_is_secure(env)) {

        changed_daif = (env->daif ^ val) & mask;

        if (changed_daif & CPSR_A) {
            /* Check to see if we are allowed to change the masking of async
             * abort exceptions from a non-secure state.
             */
            if (!(env->cp15.scr_el3 & SCR_AW)) {
                qemu_log_mask(LOG_GUEST_ERROR,
                              "Ignoring attempt to switch CPSR_A flag from "
                              "non-secure world with SCR.AW bit clear\n");
                mask &= ~CPSR_A;
            }
        }

        if (changed_daif & CPSR_F) {
            /* Check to see if we are allowed to change the masking of FIQ
             * exceptions from a non-secure state.
             */
            if (!(env->cp15.scr_el3 & SCR_FW)) {
                qemu_log_mask(LOG_GUEST_ERROR,
                              "Ignoring attempt to switch CPSR_F flag from "
                              "non-secure world with SCR.FW bit clear\n");
                mask &= ~CPSR_F;
            }

            /* Check whether non-maskable FIQ (NMFI) support is enabled.
             * If this bit is set software is not allowed to mask
             * FIQs, but is allowed to set CPSR_F to 0.
             */
            if ((A32_BANKED_CURRENT_REG_GET(env, sctlr) & SCTLR_NMFI) &&
                (val & CPSR_F)) {
                qemu_log_mask(LOG_GUEST_ERROR,
                              "Ignoring attempt to enable CPSR_F flag "
                              "(non-maskable FIQ [NMFI] support enabled)\n");
                mask &= ~CPSR_F;
            }
        }
    }

    env->daif &= ~(CPSR_AIF & mask);
    env->daif |= val & CPSR_AIF & mask;

    if (write_type != CPSRWriteRaw &&
        ((env->uncached_cpsr ^ val) & mask & CPSR_M)) {
        if ((env->uncached_cpsr & CPSR_M) == ARM_CPU_MODE_USR) {
            /* Note that we can only get here in USR mode if this is a
             * gdb stub write; for this case we follow the architectural
             * behaviour for guest writes in USR mode of ignoring an attempt
             * to switch mode. (Those are caught by translate.c for writes
             * triggered by guest instructions.)
             */
            // Unicorn: No, it can also be uc_reg_write, let user switch registers banks.
            if (write_type == CPSRWriteByUnicorn) {
                switch_mode(env, val & CPSR_M);
            } else {
                mask &= ~CPSR_M;
            }
        } else if (bad_mode_switch(env, val & CPSR_M, write_type)) {
            /* Attempt to switch to an invalid mode: this is UNPREDICTABLE in
             * v7, and has defined behaviour in v8:
             *  + leave CPSR.M untouched
             *  + allow changes to the other CPSR fields
             *  + set PSTATE.IL
             * For user changes via the GDB stub, we don't set PSTATE.IL,
             * as this would be unnecessarily harsh for a user error.
             */
            mask &= ~CPSR_M;
            if (write_type != CPSRWriteByGDBStub &&
                arm_feature(env, ARM_FEATURE_V8)) {
                mask |= CPSR_IL;
                val |= CPSR_IL;
            }
            qemu_log_mask(LOG_GUEST_ERROR,
                          "Illegal AArch32 mode switch attempt from %s to %s\n",
                          aarch32_mode_name(env->uncached_cpsr),
                          aarch32_mode_name(val));
        } else {
            qemu_log_mask(CPU_LOG_INT, "%s %s to %s PC 0x%" PRIx32 "\n",
                          write_type == CPSRWriteExceptionReturn ?
                          "Exception return from AArch32" :
                          "AArch32 mode switch from",
                          aarch32_mode_name(env->uncached_cpsr),
                          aarch32_mode_name(val), env->regs[15]);
            switch_mode(env, val & CPSR_M);
        }
    }
    mask &= ~CACHED_CPSR_BITS;
    env->uncached_cpsr = (env->uncached_cpsr & ~mask) | (val & mask);
}